

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O0

DASHEventMessageBoxv1 *
event_track::generate_random_event
          (DASHEventMessageBoxv1 *__return_storage_ptr__,bool set_duration_to_zero,uint32_t max_p,
          uint32_t max_d)

{
  uint32_t uVar1;
  uint64_t uVar2;
  result_type_conflict rVar3;
  result_type rVar4;
  reference pvVar5;
  undefined1 local_2768 [8];
  uniform_int_distribution<unsigned_long> distD;
  uniform_int_distribution<unsigned_long> distP;
  undefined1 local_2738 [8];
  mt19937 rng;
  random_device dev;
  default_random_engine generator;
  uint32_t max_d_local;
  uint32_t max_p_local;
  bool set_duration_to_zero_local;
  DASHEventMessageBoxv1 *e;
  
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &dev.field_0._M_mt._M_p);
  std::random_device::random_device((random_device *)&rng._M_p);
  rVar3 = std::random_device::operator()((random_device *)&rng._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2738,(ulong)rVar3);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)&distD._M_param._M_b,1,(ulong)max_p);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)local_2768,1,(ulong)max_d);
  DASHEventMessageBoxv1::DASHEventMessageBoxv1(__return_storage_ptr__);
  if (set_duration_to_zero) {
    __return_storage_ptr__->event_duration_ = 0;
  }
  else {
    rVar4 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)local_2768,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_2738);
    __return_storage_ptr__->event_duration_ = (uint32_t)rVar4;
  }
  rVar4 = std::uniform_int_distribution<unsigned_long>::operator()
                    ((uniform_int_distribution<unsigned_long> *)&distD._M_param._M_b,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)local_2738);
  __return_storage_ptr__->presentation_time_ = rVar4;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->scheme_id_uri_,"random-1-100");
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->value_,"");
  *(undefined4 *)&(__return_storage_ptr__->super_full_box).field_0x6c = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&__return_storage_ptr__->message_data_,2);
  uVar2 = __return_storage_ptr__->presentation_time_;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&__return_storage_ptr__->message_data_,0);
  *pvVar5 = (value_type)uVar2;
  uVar1 = __return_storage_ptr__->event_duration_;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&__return_storage_ptr__->message_data_,1);
  *pvVar5 = (value_type)uVar1;
  std::random_device::~random_device((random_device *)&rng._M_p);
  return __return_storage_ptr__;
}

Assistant:

event_track::DASHEventMessageBoxv1 event_track::generate_random_event(bool set_duration_to_zero, uint32_t max_p , uint32_t max_d )
{
	std::default_random_engine generator;
	std::random_device dev;
	std::mt19937 rng(dev());

	std::uniform_int_distribution<std::mt19937::result_type> distP(1, max_p);
	std::uniform_int_distribution<std::mt19937::result_type> distD(1, max_d);

	event_track::DASHEventMessageBoxv1 e;

	if (!set_duration_to_zero)
		e.event_duration_ = distD(rng);
	else
		e.event_duration_ = 0;

	e.presentation_time_ = distP(rng);
	e.scheme_id_uri_ = "random-1-100";
	e.value_ = "";
	e.timescale_ = 1;
	e.message_data_.resize(2);
	e.message_data_[0] = (uint8_t)e.presentation_time_;
	e.message_data_[1] = (uint8_t)e.event_duration_;

	return e;
}